

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseUDP.cpp
# Opt level: O1

void __thiscall tonk::UDPSocket::postNextRead(UDPSocket *this,uint8_t *readBuffer)

{
  socket_type sVar1;
  basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *pbVar2;
  long lVar3;
  reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseUDP_cpp:400:9)>
  *op;
  error_category *peVar4;
  base_implementation_type *impl;
  thread_info_base *this_thread;
  long in_FS_OFFSET;
  ptr local_60;
  UDPAddress *local_48;
  anon_class_16_2_48e8bdf1 local_40;
  
  local_48 = &this->SourceAddress;
  (this->SourceAddress).impl_.data_.base.sa_family = 2;
  *(undefined8 *)((long)&(this->SourceAddress).impl_.data_ + 2) = 0;
  *(undefined8 *)((long)&(this->SourceAddress).impl_.data_ + 10) = 0;
  *(undefined8 *)((long)&(this->SourceAddress).impl_.data_ + 0xc) = 0;
  *(undefined8 *)((long)&(this->SourceAddress).impl_.data_ + 0x14) = 0;
  pbVar2 = (this->Socket)._M_t.
           super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
           .
           super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
           ._M_head_impl;
  local_60.h = &local_40;
  lVar3 = *(long *)&(pbVar2->
                    super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                    ).super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>;
  impl = (base_implementation_type *)
         ((long)&(pbVar2->
                 super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>).
                 super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true> + 8);
  if (*(long *)(in_FS_OFFSET + -0x10) == 0) {
    this_thread = (thread_info_base *)0x0;
  }
  else {
    this_thread = *(thread_info_base **)(*(long *)(in_FS_OFFSET + -0x10) + 8);
  }
  local_40.this = this;
  local_40.readBuffer = readBuffer;
  op = (reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseUDP_cpp:400:9)>
        *)asio::detail::thread_info_base::allocate(this_thread,0x70);
  local_60.p = (reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseUDP_cpp:400:9)>
                *)0x0;
  sVar1 = impl->socket_;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).super_reactor_op.super_operation.next_ = (scheduler_operation *)0x0;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).super_reactor_op.super_operation.func_ =
       asio::detail::
       reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseUDP.cpp:400:9)>
       ::do_complete;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).super_reactor_op.super_operation.task_result_ = 0;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).super_reactor_op.ec_._M_value = 0;
  local_60.v = op;
  peVar4 = (error_category *)std::_V2::system_category();
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).super_reactor_op.ec_._M_cat = peVar4;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).super_reactor_op.bytes_transferred_ = 0;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).super_reactor_op.perform_func_ =
       asio::detail::
       reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
       ::do_perform;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).socket_ = sVar1;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).protocol_type_ = 2;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).buffers_.super_mutable_buffer.data_ = readBuffer;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).buffers_.super_mutable_buffer.size_ = 0x546;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).sender_endpoint_ = local_48;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).flags_ = 0;
  (op->handler_).this = local_40.this;
  (op->handler_).readBuffer = local_40.readBuffer;
  local_60.p = op;
  asio::detail::reactive_socket_service_base::start_op
            ((reactive_socket_service_base *)(lVar3 + 0x28),impl,0,(reactor_op *)op,false,true,false
            );
  local_60.v = (reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseUDP_cpp:400:9)>
                *)0x0;
  local_60.p = (reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseUDP_cpp:400:9)>
                *)0x0;
  asio::detail::
  reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseUDP.cpp:400:9)>
  ::ptr::reset(&local_60);
  return;
}

Assistant:

void UDPSocket::postNextRead(uint8_t* readBuffer)
{
    // Clear source address to allow us to check if it's filled later
    // during error handling
    SourceAddress = UDPAddress();

    TONK_IF_DEBUG(++OutstandingRecvs);

    // Dispatch asynchronous recvfrom()
    Socket->async_receive_from(
        asio::buffer(readBuffer, kReadBufferBytes),
        SourceAddress,
        [this, readBuffer](const asio::error_code& error, size_t bytes_transferred)
    {
        // Grab the receive timestamp right away
        const uint64_t receiveUsec = siamese::GetTimeUsec();

        TONK_IF_DEBUG(--OutstandingRecvs);

        uint8_t* nextReadBuffer = readBuffer;

        // If there was an error reported:
        if (error)
        {
            // If no source address was provided:
            if (SourceAddress.address().is_unspecified())
            {
                if (!SocketClosed) {
                    Deps.Logger->Warning("Socket receive failed unexpectedly");
                }

                Deps.SocketRefCount->StartShutdown(
                    Tonk_NetworkFailed,
                    Result("async_receive_from failed",
                        error.message(),
                        ErrorType::Asio,
                        error.value()));

                // Note this stops posting read requests
                Deps.SocketRefCount->DecrementReferences();

                return;
            }

            // Otherwise we assume it is due to ICMP message from a peer:

            // Handle peer-specific failure that is not catastrophic
            IConnection* icon = AddressMap.FindByAddr(SourceAddress);
            if (icon) {
                Connection* connection = reinterpret_cast<Connection*>(icon);
                connection->OnICMPError(error);
            }

            // Fall-thru to continue reading datagrams
        }
        else if (bytes_transferred <= 0)
        {
            if (!SocketClosed) {
                Deps.Logger->Warning("Socket closed unexpectedly");
            }

            // Start shutdown
            Deps.SocketRefCount->StartShutdown(Tonk_NetworkFailed, Result("UDP socket closed", "Socket closed", ErrorType::Tonk, Tonk_NetworkFailed));

            // Note no read request is posted here
            Deps.SocketRefCount->DecrementReferences();

            return;
        }
        else
        {
#ifdef TONK_FOIL_BUFFER_STEALING
            // Clear remaining receive buffer to foil buffer-stealing attacks
            memset(buffer + bytes_transferred, 0xfe, bufferBytes - bytes_transferred);
#endif

#ifdef TONK_ENABLE_ARTIFICIAL_PACKETLOSS
            if (m_ArtificialPacketlossThreshold > 0)
            {
                const uint32_t word = ArtificialPacketlossPRNG.Next() & 0x7fffffff;
                if (word < m_ArtificialPacketlossThreshold)
                {
                    //ModuleLogger.Trace("ARTIFICAL DROPPED DATAGRAM HERE");

                    // Reuse the same read buffer to post another read request
                    postNextRead(nextReadBuffer);

                    return; // Do not handle this datagram
                }
            }
#endif // TONK_ENABLE_ARTIFICIAL_PACKETLOSS

            TONK_DEBUG_ASSERT(bytes_transferred <= kReadBufferBytes);
            const unsigned receivedBytes = static_cast<unsigned>(bytes_transferred);

            const BufferResult result = onUDPDatagram(
                receiveUsec,
                SourceAddress,
                readBuffer,
                receivedBytes);

            if (result == BufferResult::InUse) {
                // Allocate a new buffer for the next read
                nextReadBuffer = Deps.ReadBufferAllocator->Allocate(kReadBufferBytes);
            }
        }

        // Post next read buffer
        postNextRead(nextReadBuffer);
    });
}